

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mttgpr_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1,uint32_t sel)

{
  ulong uVar1;
  
  if (((env->CP0_VPEConf0 & 2) != 0) &&
     (uVar1 = (long)(ulong)(byte)env->CP0_VPEControl %
              (long)*(int *)((long)env[-3].tcs[0xc].gpr + 0x94), (uint32_t)uVar1 != env->current_tc)
     ) {
    env = (CPUMIPSState_conflict5 *)(env->tcs + (uVar1 & 0xffffffff));
  }
  (env->active_tc).gpr[sel] = arg1;
  return;
}

Assistant:

void helper_mttgpr(CPUMIPSState *env, target_ulong arg1, uint32_t sel)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        other->active_tc.gpr[sel] = arg1;
    } else {
        other->tcs[other_tc].gpr[sel] = arg1;
    }
}